

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primesum.cpp
# Opt level: O3

int primesum::get_num_threads(void)

{
  return 1;
}

Assistant:

int get_num_threads()
{
#ifdef _OPENMP
  if (threads_)
    return threads_;
  else
    return max(1, omp_get_max_threads());
#else
  return 1;
#endif
}